

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

exr_result_t exr_attr_string_init_static(exr_context_t ctxt,exr_attr_string_t *s,char *v)

{
  size_t sVar1;
  char *in_RDX;
  char *in_RSI;
  exr_attr_string_t *in_RDI;
  _internal_exr_context *pctxt;
  int32_t length;
  size_t fulllen;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar2;
  
  if ((in_RDX == (char *)0x0) || (sVar1 = strlen(in_RDX), sVar1 < 0x7fffffff)) {
    eVar2 = exr_attr_string_init_static_with_length
                      ((exr_context_t)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,in_RSI,(int32_t)((ulong)in_RDX >> 0x20));
  }
  else if (in_RDI == (exr_attr_string_t *)0x0) {
    eVar2 = 2;
  }
  else {
    eVar2 = (**(code **)(in_RDI + 4))(in_RDI,3,"Invalid string too long for attribute");
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_string_init_static (
    exr_context_t ctxt, exr_attr_string_t* s, const char* v)
{
    size_t  fulllen = 0;
    int32_t length  = 0;

    if (v)
    {
        fulllen = strlen (v);
        if (fulllen >= (size_t) INT32_MAX)
        {
            INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);
            return pctxt->report_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid string too long for attribute");
        }
        length = (int32_t) fulllen;
    }
    return exr_attr_string_init_static_with_length (ctxt, s, v, length);
}